

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O0

void __thiscall ltc::set_store_data(ltc *this,ltc_store_data *data)

{
  float fVar1;
  const_reference pvVar2;
  mat<3,_3,_float,_(glm::precision)0> *m;
  mat<4,_4,_float,_(glm::precision)0> local_f0;
  mat<3,_3,_float,_(glm::precision)0> local_b0;
  vec<3,_float,_(glm::precision)0> local_8c;
  vec<3,_float,_(glm::precision)0> local_80;
  vec<3,_float,_(glm::precision)0> local_74;
  mat<3,_3,_float,_(glm::precision)0> local_68;
  mat<3,_3,_float,_(glm::precision)0> local_44;
  ltc_store_data *local_20;
  array<float,_5UL> *mtx;
  ltc_store_data *data_local;
  ltc *this_local;
  
  this->_amplitude = data->distribution_norm;
  this->_fresnel = data->fresnel_term;
  local_20 = data;
  mtx = &data->matrix_parameters;
  data_local = (ltc_store_data *)this;
  pvVar2 = std::array<float,_5UL>::operator[](&data->matrix_parameters,0);
  fVar1 = *pvVar2;
  pvVar2 = std::array<float,_5UL>::operator[](&local_20->matrix_parameters,1);
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_74,fVar1,0.0,*pvVar2);
  pvVar2 = std::array<float,_5UL>::operator[](&local_20->matrix_parameters,2);
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_80,0.0,*pvVar2,0.0);
  pvVar2 = std::array<float,_5UL>::operator[](&local_20->matrix_parameters,3);
  fVar1 = *pvVar2;
  pvVar2 = std::array<float,_5UL>::operator[](&local_20->matrix_parameters,4);
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_8c,fVar1,0.0,*pvVar2);
  glm::mat<3,_3,_float,_(glm::precision)0>::mat(&local_68,&local_74,&local_80,&local_8c);
  glm::inverse<3,3,float,(glm::precision)0,glm::mat>(&local_44,(glm *)&local_68,m);
  set_ltc_matrix(this,&local_44);
  glm::mat<4,_4,_float,_(glm::precision)0>::mat(&local_f0);
  glm::mat<3,_3,_float,_(glm::precision)0>::mat(&local_b0,&local_f0);
  memcpy(&this->_base_frame,&local_b0,0x24);
  return;
}

Assistant:

void ltc::set_store_data(const ltc_store_data &data)
{
  _amplitude = data.distribution_norm;
  _fresnel = data.fresnel_term;

  // TODO: Inverse may cause loss of data. It is done at least once during fitting process.
  const auto &mtx = data.matrix_parameters;
  set_ltc_matrix(glm::inverse(glm::mat3{
    {mtx[0], 0.0f,   mtx[1]},
    {0.0f,   mtx[2], 0.0f},
    {mtx[3], 0.0f,   mtx[4]}
  }));

  _base_frame = glm::mat4{};
}